

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

void cppwinrt::write_produce_upcall
               (writer *w,string_view *upcall,method_signature *method_signature)

{
  bool bVar1;
  RetTypeSig *pRVar2;
  vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
  *this;
  reference __in;
  type *this_00;
  type *ppPVar3;
  TypeSig *pTVar4;
  bool local_109;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  undefined1 local_c0 [8];
  string_view param_name;
  type *param_signature;
  type *param;
  __normal_iterator<const_std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_*,_std::vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>_>
  local_90;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
  *__range1;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  anon_class_8_1_89897ddb_conflict1 local_60;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  anon_class_8_1_89897ddb_conflict1 local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  undefined1 local_30 [8];
  string_view name;
  method_signature *method_signature_local;
  string_view *upcall_local;
  writer *w_local;
  
  name._M_str = (char *)method_signature;
  pRVar2 = cppwinrt::method_signature::return_signature(method_signature);
  bVar1 = winmd::reader::RetTypeSig::operator_cast_to_bool(pRVar2);
  if (bVar1) {
    _local_30 = cppwinrt::method_signature::return_param_name((method_signature *)name._M_str);
    pRVar2 = cppwinrt::method_signature::return_signature((method_signature *)name._M_str);
    pTVar4 = winmd::reader::RetTypeSig::Type(pRVar2);
    bVar1 = winmd::reader::TypeSig::is_szarray(pTVar4);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_40,"std::tie(*__%Size, *%) = detach_abi(%(%));");
      local_48 = bind<&cppwinrt::write_produce_args,_const_cppwinrt::method_signature_&>
                           ((method_signature *)name._M_str);
      writer_base<cppwinrt::writer>::
      write<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                (&w->super_writer_base<cppwinrt::writer>,&local_40,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_30,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_30,upcall,&local_48);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_58,"*% = detach_from<%>(%(%));");
      pRVar2 = cppwinrt::method_signature::return_signature((method_signature *)name._M_str);
      local_60 = bind<&cppwinrt::write_produce_args,_const_cppwinrt::method_signature_&>
                           ((method_signature *)name._M_str);
      writer_base<cppwinrt::writer>::
      write<std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::RetTypeSig,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                (&w->super_writer_base<cppwinrt::writer>,&local_58,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_30,pRVar2,upcall,
                 &local_60);
    }
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70,"%(%);");
    __range1 = (vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                *)bind<&cppwinrt::write_produce_args,_const_cppwinrt::method_signature_&>
                            ((method_signature *)name._M_str);
    writer_base<cppwinrt::writer>::
    write<std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
              (&w->super_writer_base<cppwinrt::writer>,&local_70,upcall,
               (anon_class_8_1_89897ddb_conflict1 *)&__range1);
  }
  this = cppwinrt::method_signature::params((method_signature *)name._M_str);
  __end1 = std::
           vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
           ::begin(this);
  local_90._M_current =
       (pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*> *)
       std::
       vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
       ::end(this);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&local_90), bVar1) {
    __in = __gnu_cxx::
           __normal_iterator<const_std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_*,_std::vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>_>
           ::operator*(&__end1);
    this_00 = ::std::get<0ul,winmd::reader::Param,winmd::reader::ParamSig_const*>(__in);
    ppPVar3 = ::std::get<1ul,winmd::reader::Param,winmd::reader::ParamSig_const*>(__in);
    param_name._M_str._6_2_ = winmd::reader::Param::Flags(this_00);
    bVar1 = winmd::reader::ParamAttributes::Out((ParamAttributes *)((long)&param_name._M_str + 6));
    local_109 = false;
    if (bVar1) {
      pTVar4 = winmd::reader::ParamSig::Type(*ppPVar3);
      bVar1 = winmd::reader::TypeSig::is_szarray(pTVar4);
      local_109 = false;
      if (!bVar1) {
        pTVar4 = winmd::reader::ParamSig::Type(*ppPVar3);
        local_109 = is_object(pTVar4);
      }
    }
    if (local_109 != false) {
      _local_c0 = winmd::reader::Param::Name(this_00);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_d0,"\n                if (%) *% = detach_abi(winrt_impl_%);");
      writer_base<cppwinrt::writer>::
      write<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                (&w->super_writer_base<cppwinrt::writer>,&local_d0,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_c0,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_c0,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_c0);
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_*,_std::vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

static void write_produce_upcall(writer& w, std::string_view const& upcall, method_signature const& method_signature)
    {
        if (method_signature.return_signature())
        {
            auto name = method_signature.return_param_name();

            if (method_signature.return_signature().Type().is_szarray())
            {
                w.write("std::tie(*__%Size, *%) = detach_abi(%(%));",
                    name,
                    name,
                    upcall,
                    bind<write_produce_args>(method_signature));
            }
            else
            {
                w.write("*% = detach_from<%>(%(%));",
                    name,
                    method_signature.return_signature(),
                    upcall,
                    bind<write_produce_args>(method_signature));
            }
        }
        else
        {
            w.write("%(%);",
                upcall,
                bind<write_produce_args>(method_signature));
        }

        for (auto&& [param, param_signature] : method_signature.params())
        {
            if (param.Flags().Out() && !param_signature->Type().is_szarray() && is_object(param_signature->Type()))
            {
                auto param_name = param.Name();

                w.write("\n                if (%) *% = detach_abi(winrt_impl_%);", param_name, param_name, param_name);
            }
        }
    }